

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

QString * funcCall(Command *c,int idx)

{
  bool bVar1;
  bool bVar2;
  char *this;
  char *pcVar3;
  uint in_EDX;
  QString *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  TypedName *a;
  QList<VkSpecParser::TypedName> *__range2;
  bool first;
  QString *s;
  char16_t *str;
  char16_t *str_1;
  const_iterator __end2;
  const_iterator __begin2;
  DataPointer *in_stack_fffffffffffffed8;
  QArrayDataPointer<char16_t> *this_00;
  QString *pQVar4;
  QChar c_00;
  QChar local_a2;
  QArrayDataPointer<char16_t> local_a0 [2];
  TypedName *local_70;
  const_iterator local_68;
  const_iterator local_60;
  QChar local_52 [13];
  QArrayDataPointer<char16_t> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->d)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  in_RDI->ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  in_RDI->size = -0x5555555555555556;
  pQVar4 = in_RSI + 1;
  this_00 = in_RDI;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_38,(Data *)0x0,L"void",4);
  QString::QString((QString *)this_00,in_stack_fffffffffffffed8);
  bVar1 = operator==((QString *)this_00,(QString *)in_stack_fffffffffffffed8);
  this = "return ";
  if (bVar1) {
    this = "";
  }
  QtPrivate::asString(in_RSI);
  QString::toLocal8Bit((QString *)this);
  pcVar3 = QByteArray::constData((QByteArray *)0x105932);
  QString::asprintf((char *)in_RDI,"%sreinterpret_cast<PFN_%s>(d_ptr->m_funcs[%d])",this,pcVar3,
                    (ulong)in_EDX);
  QByteArray::~QByteArray((QByteArray *)0x10595f);
  QString::~QString((QString *)0x10596c);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  bVar1 = QList<VkSpecParser::TypedName>::isEmpty((QList<VkSpecParser::TypedName> *)0x105987);
  if (!bVar1) {
    QChar::QChar<char16_t,_true>(local_52,L'(');
    QString::operator+=((QString *)this_00,(QChar)(char16_t)((ulong)pQVar4 >> 0x30));
    bVar1 = true;
    local_60.i = (TypedName *)0xaaaaaaaaaaaaaaaa;
    local_60 = QList<VkSpecParser::TypedName>::begin((QList<VkSpecParser::TypedName> *)this_00);
    local_68.i = (TypedName *)0xaaaaaaaaaaaaaaaa;
    local_68 = QList<VkSpecParser::TypedName>::end((QList<VkSpecParser::TypedName> *)this_00);
    while( true ) {
      local_70 = local_68.i;
      bVar2 = QList<VkSpecParser::TypedName>::const_iterator::operator!=(&local_60,local_68);
      c_00.ucs = (char16_t)((ulong)pQVar4 >> 0x30);
      if (!bVar2) break;
      QList<VkSpecParser::TypedName>::const_iterator::operator*(&local_60);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_a0,(Data *)0x0,L", ",2);
        QString::QString((QString *)this_00,in_stack_fffffffffffffed8);
        QString::operator+=((QString *)this_00,(QString *)in_stack_fffffffffffffed8);
        QString::~QString((QString *)0x105ae3);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
      }
      QString::operator+=((QString *)this_00,(QString *)in_stack_fffffffffffffed8);
      QList<VkSpecParser::TypedName>::const_iterator::operator++(&local_60);
    }
    QChar::QChar<char16_t,_true>(&local_a2,L')');
    QString::operator+=((QString *)this_00,c_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)this_00;
}

Assistant:

QString funcCall(const VkSpecParser::Command &c, int idx)
{
    // template:
    //     [return] reinterpret_cast<PFN_vkEnumeratePhysicalDevices>(d_ptr->m_funcs[0])(instance, pPhysicalDeviceCount, pPhysicalDevices);
    QString s = QString::asprintf("%sreinterpret_cast<PFN_%s>(d_ptr->m_funcs[%d])",
                                  (c.cmd.type == QStringLiteral("void") ? "" : "return "),
                                  qPrintable(c.cmd.name),
                                  idx);
    if (!c.args.isEmpty()) {
        s += u'(';
        bool first = true;
        for (const VkSpecParser::TypedName &a : c.args) {
            if (!first)
                s += QStringLiteral(", ");
            else
                first = false;
            s += a.name;
        }
        s += u')';
    }
    return s;
}